

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeitem.cpp
# Opt level: O1

UINT8 __thiscall TreeItem::insertChildAfter(TreeItem *this,TreeItem *item,TreeItem *newItem)

{
  size_t *psVar1;
  TreeItem *pTVar2;
  UINT8 UVar3;
  _List_node_base *p_Var4;
  
  pTVar2 = (TreeItem *)
           (this->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while ((pTVar2 != this &&
         ((TreeItem *)
          (pTVar2->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>._M_impl.
          _M_node._M_size != item))) {
    pTVar2 = (TreeItem *)
             (pTVar2->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
  }
  if (pTVar2 == this) {
    UVar3 = '\b';
  }
  else {
    p_Var4 = (_List_node_base *)operator_new(0x18);
    p_Var4[1]._M_next = (_List_node_base *)newItem;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    psVar1 = &(this->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
    UVar3 = '\0';
  }
  return UVar3;
}

Assistant:

UINT8 TreeItem::insertChildAfter(TreeItem *item, TreeItem *newItem)
{
    std::list<TreeItem*>::iterator found = std::find(childItems.begin(), childItems.end(), item);
    if (found == childItems.end())
        return U_ITEM_NOT_FOUND;
    childItems.insert(++found, newItem);
    return U_SUCCESS;
}